

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintMask(_U_UINT mask,_U_UINT number)

{
  undefined4 local_24;
  ulong uStack_20;
  _US32 i;
  _U_UINT current_bit;
  _U_UINT number_local;
  _U_UINT mask_local;
  
  uStack_20 = 0x80000000;
  for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
    if ((uStack_20 & mask) == 0) {
      putchar(0x58);
    }
    else if ((uStack_20 & number) == 0) {
      putchar(0x30);
    }
    else {
      putchar(0x31);
    }
    uStack_20 = uStack_20 >> 1;
  }
  return;
}

Assistant:

void UnityPrintMask(const _U_UINT mask, const _U_UINT number)
{
    _U_UINT current_bit = (_U_UINT)1 << (UNITY_INT_WIDTH - 1);
    _US32 i;

    for (i = 0; i < UNITY_INT_WIDTH; i++)
    {
        if (current_bit & mask)
        {
            if (current_bit & number)
            {
                UNITY_OUTPUT_CHAR('1');
            }
            else
            {
                UNITY_OUTPUT_CHAR('0');
            }
        }
        else
        {
            UNITY_OUTPUT_CHAR('X');
        }
        current_bit = current_bit >> 1;
    }
}